

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O1

void __thiscall QPainter::setFont(QPainter *this,QFont *font)

{
  uint *puVar1;
  uint uVar2;
  _Head_base<0UL,_QPainterPrivate_*,_false> _Var3;
  _Head_base<0UL,_QPainterPrivate_*,_false> _Var4;
  __uniq_ptr_impl<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor> _Var5;
  long lVar6;
  unique_ptr<QPainterState,_std::default_delete<QPainterState>_> uVar7;
  totally_ordered_wrapper<QFontPrivate_*> tVar8;
  QPainterPrivate *d;
  QPaintDevice **ppQVar9;
  long in_FS_OFFSET;
  QFont local_40;
  QFont local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  _Var3._M_head_impl =
       (this->d_ptr)._M_t.
       super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
       super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
       super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl;
  if ((tuple<QPaintEngine_*,_QPainterPrivate::QPaintEngineDestructor>)
      *(tuple<QPaintEngine_*,_QPainterPrivate::QPaintEngineDestructor> *)
       &((_Var3._M_head_impl)->engine)._M_t ==
      (__uniq_ptr_impl<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor>)0x0) {
    setFont();
  }
  else {
    QFont::resolve(&local_40,font);
    _Var4._M_head_impl =
         (this->d_ptr)._M_t.
         super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
         super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
         super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl;
    _Var5._M_t.super__Tuple_impl<0UL,_QPaintEngine_*,_QPainterPrivate::QPaintEngineDestructor>.
    super__Head_base<0UL,_QPaintEngine_*,_false>._M_head_impl =
         *(tuple<QPaintEngine_*,_QPainterPrivate::QPaintEngineDestructor> *)
          &((_Var4._M_head_impl)->engine)._M_t;
    if (((__uniq_ptr_impl<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor>)
         _Var5._M_t.super__Tuple_impl<0UL,_QPaintEngine_*,_QPainterPrivate::QPaintEngineDestructor>.
         super__Head_base<0UL,_QPaintEngine_*,_false>._M_head_impl ==
         (__uniq_ptr_impl<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor>)0x0) ||
       (lVar6 = *(long *)((long)_Var5._M_t.
                                super__Tuple_impl<0UL,_QPaintEngine_*,_QPainterPrivate::QPaintEngineDestructor>
                                .super__Head_base<0UL,_QPaintEngine_*,_false>._M_head_impl + 0x18),
       *(long *)(lVar6 + 0x90) == 0)) {
      ppQVar9 = &(_Var4._M_head_impl)->original_device;
    }
    else {
      ppQVar9 = (QPaintDevice **)(lVar6 + 0x90);
    }
    QFont::QFont(&local_30,&local_40,*ppQVar9);
    uVar7._M_t.super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>._M_t.
    super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>.
    super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl = ((_Var3._M_head_impl)->state)._M_t;
    tVar8.ptr = *(QFontPrivate **)
                 ((long)uVar7._M_t.
                        super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>
                        .super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl + 0x20);
    ((totally_ordered_wrapper<QFontPrivate_*> *)
    ((long)uVar7._M_t.super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>._M_t
           .super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>.
           super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl + 0x20))->ptr =
         (QFontPrivate *)local_30.d.d.ptr;
    uVar2 = *(uint *)((long)uVar7._M_t.
                            super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>
                            .super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl + 0x28);
    *(uint *)((long)uVar7._M_t.
                    super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>._M_t.
                    super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>.
                    super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl + 0x28) =
         local_30.resolve_mask;
    local_30.d.d.ptr =
         (totally_ordered_wrapper<QFontPrivate_*>)(totally_ordered_wrapper<QFontPrivate_*>)tVar8.ptr
    ;
    local_30.resolve_mask = uVar2;
    QFont::~QFont(&local_30);
    QFont::~QFont(&local_40);
    if ((_Var3._M_head_impl)->extended == (QPaintEngineEx *)0x0) {
      puVar1 = (uint *)((long)((_Var3._M_head_impl)->state)._M_t + 8);
      *puVar1 = *puVar1 | 8;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPainter::setFont(const QFont &font)
{
    Q_D(QPainter);

#ifdef QT_DEBUG_DRAW
    if (qt_show_painter_debug_output)
        printf("QPainter::setFont(), family=%s, pointSize=%d\n", font.families().first().toLatin1().constData(), font.pointSize());
#endif

    if (!d->engine) {
        qWarning("QPainter::setFont: Painter not active");
        return;
    }

    d->state->font = QFont(font.resolve(d->state->deviceFont), device());
    if (!d->extended)
        d->state->dirtyFlags |= QPaintEngine::DirtyFont;
}